

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orang.h
# Opt level: O3

void __thiscall Orang::Orang(Orang *this)

{
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Orang() {
    addPoint(Point<double>(412,300));
    addPoint(Point<double>(420,300));
    addPoint(Point<double>(420,308));
    addPoint(Point<double>(428,308));
    addPoint(Point<double>(428,316));
    addPoint(Point<double>(437,316));
    addPoint(Point<double>(437,358));
    addPoint(Point<double>(429,358));
    addPoint(Point<double>(429,366));
    addPoint(Point<double>(421,366));
    addPoint(Point<double>(421,375));
    addPoint(Point<double>(454,375));
    addPoint(Point<double>(454,385));
    addPoint(Point<double>(462,385));
    addPoint(Point<double>(462,467));
    addPoint(Point<double>(464,467));
    addPoint(Point<double>(464,490));
    addPoint(Point<double>(443,490));
    addPoint(Point<double>(443,467));
    addPoint(Point<double>(445,467));
    addPoint(Point<double>(445,400));
    addPoint(Point<double>(437,400));
    addPoint(Point<double>(437,590));
    addPoint(Point<double>(445,590));
    addPoint(Point<double>(445,600));
    addPoint(Point<double>(410,600));
    addPoint(Point<double>(410,520));
    addPoint(Point<double>(400,510));
    addPoint(Point<double>(390,520));
    addPoint(Point<double>(390,600));
    addPoint(Point<double>(355,600));
    addPoint(Point<double>(355,590));
    addPoint(Point<double>(363,590));
    addPoint(Point<double>(363,400));
    addPoint(Point<double>(355,400));
    addPoint(Point<double>(355,467));
    addPoint(Point<double>(357,467));
    addPoint(Point<double>(357,490));
    addPoint(Point<double>(336,490));
    addPoint(Point<double>(336,467));
    addPoint(Point<double>(338,467));
    addPoint(Point<double>(338,385));
    addPoint(Point<double>(346,385));
    addPoint(Point<double>(346,375));
    addPoint(Point<double>(392,375));
    addPoint(Point<double>(374,375));
    addPoint(Point<double>(374,366));
    addPoint(Point<double>(366,366));
    addPoint(Point<double>(366,358));
    addPoint(Point<double>(358,358));
    addPoint(Point<double>(358,316));
    addPoint(Point<double>(366,316));
    addPoint(Point<double>(366,308));
    addPoint(Point<double>(374,308));
    addPoint(Point<double>(374,300));
  }